

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_sat_addsub_64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 reg,TCGv_i64 val,_Bool u,_Bool d)

{
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 c2;
  undefined7 in_register_00000009;
  TCGv_i64 pTVar1;
  uintptr_t o_3;
  TCGv_i64 ret;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_4;
  TCGv_i64 arg1;
  TCGv_i64 pTVar2;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)tcg_ctx);
  a1_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)a1_00 - (long)tcg_ctx);
  if ((int)CONCAT71(in_register_00000009,u) == 0) {
    pTVar1 = reg + (long)&tcg_ctx->pool_cur;
    pTVar2 = val + (long)&tcg_ctx->pool_cur;
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)pTVar1,(TCGArg)pTVar2);
    if (d) {
      tcg_gen_sub_i64(tcg_ctx,arg1,reg,val);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)a1_00);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_and_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)pTVar1);
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar1,0x8000000000000000);
      c2 = tcg_const_i64_aarch64(tcg_ctx,0);
      pTVar1 = reg;
      pTVar2 = arg1;
    }
    else {
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i64,(TCGArg)a1_00,(TCGArg)pTVar1,(TCGArg)pTVar2);
      tcg_gen_andc_i64_aarch64(tcg_ctx,ret,arg1,ret);
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)a1_00,0x7fffffffffffffff);
      c2 = tcg_const_i64_aarch64(tcg_ctx,0);
      pTVar1 = arg1;
      pTVar2 = reg;
    }
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LT,reg,ret,c2,pTVar1,pTVar2);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  }
  else {
    if (d) {
      tcg_gen_sub_i64(tcg_ctx,ret,reg,val);
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)a1_00,0);
      pTVar1 = reg;
    }
    else {
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)a1,
                          (TCGArg)(reg + (long)&tcg_ctx->pool_cur),(TCGArg)(val + (long)tcg_ctx));
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)a1_00,0xffffffffffffffff);
      pTVar1 = ret;
      val = reg;
    }
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LTU,reg,pTVar1,val,arg1,ret);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_sat_addsub_64(TCGContext *tcg_ctx, TCGv_i64 reg, TCGv_i64 val, bool u, bool d)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2;

    if (u) {
        if (d) {
            tcg_gen_sub_i64(tcg_ctx, t0, reg, val);
            tcg_gen_movi_i64(tcg_ctx, t1, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, reg, reg, val, t1, t0);
        } else {
            tcg_gen_add_i64(tcg_ctx, t0, reg, val);
            tcg_gen_movi_i64(tcg_ctx, t1, -1);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, reg, t0, reg, t1, t0);
        }
    } else {
        if (d) {
            /* Detect signed overflow for subtraction.  */
            tcg_gen_xor_i64(tcg_ctx, t0, reg, val);
            tcg_gen_sub_i64(tcg_ctx, t1, reg, val);
            tcg_gen_xor_i64(tcg_ctx, reg, reg, t1);
            tcg_gen_and_i64(tcg_ctx, t0, t0, reg);

            /* Bound the result.  */
            tcg_gen_movi_i64(tcg_ctx, reg, INT64_MIN);
            t2 = tcg_const_i64(tcg_ctx, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, reg, t0, t2, reg, t1);
        } else {
            /* Detect signed overflow for addition.  */
            tcg_gen_xor_i64(tcg_ctx, t0, reg, val);
            tcg_gen_add_i64(tcg_ctx, reg, reg, val);
            tcg_gen_xor_i64(tcg_ctx, t1, reg, val);
            tcg_gen_andc_i64(tcg_ctx, t0, t1, t0);

            /* Bound the result.  */
            tcg_gen_movi_i64(tcg_ctx, t1, INT64_MAX);
            t2 = tcg_const_i64(tcg_ctx, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, reg, t0, t2, t1, reg);
        }
        tcg_temp_free_i64(tcg_ctx, t2);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}